

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXSpectrumTAP.cpp
# Opt level: O1

Pulse __thiscall Storage::Tape::ZXSpectrumTAP::virtual_get_next_pulse(ZXSpectrumTAP *this)

{
  int iVar1;
  Time TVar2;
  Phase PVar3;
  Type TVar4;
  Pulse PVar5;
  uint8_t uVar6;
  uint uVar7;
  int iVar8;
  Type local_28;
  Time TStack_24;
  
  TStack_24.length = 0;
  TStack_24.clock_rate = 1;
  PVar3 = this->phase_;
  if (PVar3 == Gap) {
    local_28 = Zero;
    TStack_24.length = 1;
    TStack_24.clock_rate = 1;
    read_next_block(this);
  }
  else {
    TVar4 = this->distance_into_phase_;
    local_28 = TVar4 & Low ^ Low;
    if (PVar3 == Data) {
      TVar2.length = 0x6ae;
      TVar2.clock_rate = 3500000;
      TStack_24.length = 0x357;
      TStack_24.clock_rate = 3500000;
      if ((char)this->data_byte_ < '\0') {
        TStack_24 = TVar2;
      }
      uVar7 = TVar4 + Low;
      this->distance_into_phase_ = uVar7;
      if ((TVar4 & Low) != High) {
        this->data_byte_ = this->data_byte_ * '\x02';
      }
      if ((uVar7 & 0xf) == 0) {
        if ((int)uVar7 >> 4 == (uint)this->block_length_) {
          if (this->block_type_ == '\0') {
            read_next_block(this);
          }
          else {
            this->phase_ = Gap;
            this->distance_into_phase_ = 0;
          }
        }
        else {
          uVar6 = FileHolder::get8(&this->file_);
          this->data_byte_ = uVar6;
        }
      }
    }
    else if (PVar3 == PilotTone) {
      iVar1 = TVar4 + Low;
      this->distance_into_phase_ = iVar1;
      iVar8 = 0x1f7f;
      if (this->block_type_ == '\0') {
        iVar8 = 0xc97;
      }
      if (iVar1 < iVar8) {
        TStack_24.length = 0x10f;
        TStack_24.clock_rate = 0x6acfc;
      }
      else {
        TStack_24.length = 0x2df;
        TStack_24.clock_rate = 3500000;
        if ((TVar4 & Low) == High) {
          TStack_24.length = 0x29b;
          TStack_24.clock_rate = 3500000;
        }
        iVar8 = 0x1f80;
        if (this->block_type_ == '\0') {
          iVar8 = 0xc98;
        }
        if (iVar1 == iVar8) {
          this->phase_ = Data;
          this->distance_into_phase_ = 0;
        }
      }
    }
  }
  PVar5.length = TStack_24;
  PVar5.type = local_28;
  return PVar5;
}

Assistant:

Tape::Pulse ZXSpectrumTAP::virtual_get_next_pulse() {
	// Adopt a general pattern of high then low.
	Pulse pulse;
	pulse.type = (distance_into_phase_ & 1) ? Pulse::Type::High : Pulse::Type::Low;

	switch(phase_) {
		default: break;

		case Phase::PilotTone: {
			// Output: pulses of length 2168;
			// 8063 pulses if block type is 0, otherwise 3223;
			// then a 667-length pulse followed by a 735-length pulse.

			pulse.length = Time(271, 437'500);	// i.e. 2168 / 3'500'000
			++distance_into_phase_;

			// Check whether in the last two.
			if(distance_into_phase_ >= (block_type_ ? 8063 : 3223)) {
				pulse.length = (distance_into_phase_ & 1) ? Time(667, 3'500'000) : Time(735, 3'500'000);

				// Check whether this is the last one.
				if(distance_into_phase_ == (block_type_ ? 8064 : 3224)) {
					distance_into_phase_ = 0;
					phase_ = Phase::Data;
				}
			}
		} break;

		case Phase::Data: {
			// Output two pulses of length 855 for a 0; two of length 1710 for a 1,
			// from MSB to LSB.
			pulse.length = (data_byte_ & 0x80) ? Time(1710, 3'500'000) : Time(855, 3'500'000);
			++distance_into_phase_;

			if(!(distance_into_phase_ & 1)) {
				data_byte_ <<= 1;
			}

			if(!(distance_into_phase_ & 15)) {
				if((distance_into_phase_ >> 4) == block_length_) {
					if(block_type_) {
						distance_into_phase_ = 0;
						phase_ = Phase::Gap;
					} else {
						read_next_block();
					}
				} else {
					data_byte_ = file_.get8();
				}
			}
		} break;

		case Phase::Gap:
			Pulse gap;
			gap.type = Pulse::Type::Zero;
			gap.length = Time(1);

			read_next_block();
		return gap;
	}

	return pulse;
}